

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O3

Expression * __thiscall
wasm::TranslateToFuzzReader::makeAtomic(TranslateToFuzzReader *this,Type type)

{
  Random *this_00;
  __uniq_ptr_data<wasm::Memory,_std::default_delete<wasm::Memory>,_true,_true> _Var1;
  double dVar2;
  uintptr_t uVar3;
  uintptr_t uVar4;
  undefined8 uVar5;
  Id IVar6;
  int8_t iVar7;
  uint32_t uVar8;
  AtomicRMWOp AVar10;
  Expression *pEVar11;
  Expression *pEVar12;
  Expression *pEVar13;
  Expression *pEVar14;
  int iVar9;
  
  if (((this->wasm->features).features & 1) == 0) {
    __assert_fail("wasm.features.hasAtomics()",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/fuzzing/fuzzing.cpp"
                  ,0x1120,"Expression *wasm::TranslateToFuzzReader::makeAtomic(Type)");
  }
  if (this->allowMemory == false) {
    pEVar11 = makeTrivial(this,type);
    return pEVar11;
  }
  *(undefined1 *)
   ((long)(((this->wasm->memories).
            super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start)->_M_t).
          super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_> + 0x48) = 1;
  if (type.id != 2) {
    if (type.id == 0) {
      pEVar11 = (Expression *)MixedArena::allocSpace(&((this->builder).wasm)->allocator,0x18,8);
      *(undefined8 *)pEVar11 = 0;
      (pEVar11->type).id = 0;
      *(undefined8 *)(pEVar11 + 1) = 0;
      pEVar11->_id = AtomicFenceId;
      return pEVar11;
    }
    if (6 < type.id) {
      __assert_fail("isBasic() && \"Basic type expected\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-type.h"
                    ,0x1c4,"BasicType wasm::Type::getBasic() const");
    }
    if ((int)type.id != 3) {
      if ((int)type.id != 2) {
        wasm::handle_unreachable
                  ("unexpected type",
                   "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/fuzzing/fuzzing.cpp"
                   ,0x1161);
      }
      goto LAB_001498dd;
    }
    uVar8 = Random::upTo(&this->random,4);
    switch(uVar8) {
    case 0:
      goto switchD_0014993e_caseD_0;
    case 1:
      goto switchD_0014993e_caseD_1;
    case 2:
switchD_0014993e_caseD_2:
      iVar9 = Random::pick<int,int,int>(&this->random,1,2,4);
      IVar6 = (Id)iVar9;
      goto LAB_00149977;
    case 3:
      iVar9 = Random::pick<int,int,int,int>(&this->random,1,2,4,8);
      IVar6 = (Id)iVar9;
      goto LAB_00149977;
    default:
      wasm::handle_unreachable
                ("invalide value",
                 "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/fuzzing/fuzzing.cpp"
                 ,0x115c);
    }
  }
  uVar8 = Random::upTo(&this->random,2);
  if (uVar8 == 0) {
    pEVar11 = makePointer(this);
    pEVar12 = make(this,(Type)0x2);
    iVar7 = Random::get(&this->random);
    dVar2 = log((double)(iVar7 + 1 + (uint)(iVar7 == -1)));
    dVar2 = floor(dVar2);
    _Var1.super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>._M_t.
    super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
    super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl =
         (((this->wasm->memories).
           super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start)->_M_t).
         super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>;
    uVar3 = *(uintptr_t *)
             _Var1.super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>._M_t.
             super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
             super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl;
    uVar4 = *(uintptr_t *)
             ((long)_Var1.super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>.
                    _M_t.super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
                    super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl + 8);
    pEVar14 = (Expression *)MixedArena::allocSpace(&((this->builder).wasm)->allocator,0x38,8);
    *(undefined8 *)pEVar14 = 0x1b;
    pEVar14[2].type.id = 0;
    *(undefined8 *)(pEVar14 + 3) = 0;
    (pEVar14->type).id = 0;
    *(ulong *)(pEVar14 + 1) = (long)dVar2 & 0xffffffff;
    pEVar14[1].type.id = (uintptr_t)pEVar11;
    *(Expression **)(pEVar14 + 2) = pEVar12;
    wasm::AtomicNotify::finalize();
    pEVar14[2].type.id = uVar3;
    *(uintptr_t *)(pEVar14 + 3) = uVar4;
    return pEVar14;
  }
LAB_001498dd:
  uVar8 = Random::upTo(&this->random,3);
  if (uVar8 == 0) {
switchD_0014993e_caseD_0:
    IVar6 = BlockId;
  }
  else {
    if (uVar8 == 2) goto switchD_0014993e_caseD_2;
    if (uVar8 != 1) {
      wasm::handle_unreachable
                ("invalide value",
                 "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/fuzzing/fuzzing.cpp"
                 ,0x1149);
    }
switchD_0014993e_caseD_1:
    iVar9 = Random::pick<int,int>(&this->random,1,2);
    IVar6 = (Id)iVar9;
  }
LAB_00149977:
  this_00 = &this->random;
  iVar7 = Random::get(this_00);
  dVar2 = log((double)(iVar7 + 1 + (uint)(iVar7 == -1)));
  dVar2 = floor(dVar2);
  pEVar11 = makePointer(this);
  uVar8 = Random::upTo(this_00,2);
  pEVar12 = make(this,type);
  if (uVar8 == 0) {
    AVar10 = Random::
             pick<wasm::AtomicRMWOp,wasm::AtomicRMWOp,wasm::AtomicRMWOp,wasm::AtomicRMWOp,wasm::AtomicRMWOp,wasm::AtomicRMWOp>
                       (this_00,RMWAdd,RMWSub,RMWAnd,RMWOr,RMWXor,RMWXchg);
    _Var1.super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>._M_t.
    super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
    super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl =
         (((this->wasm->memories).
           super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start)->_M_t).
         super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>;
    uVar5 = *(undefined8 *)
             _Var1.super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>._M_t.
             super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
             super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl;
    uVar3 = *(uintptr_t *)
             ((long)_Var1.super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>.
                    _M_t.super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
                    super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl + 8);
    pEVar14 = (Expression *)MixedArena::allocSpace(&((this->builder).wasm)->allocator,0x40,8);
    *(undefined8 *)pEVar14 = 0;
    (pEVar14->type).id = 0;
    *(undefined8 *)(pEVar14 + 1) = 0;
    pEVar14->_id = AtomicRMWId;
    *(undefined8 *)(pEVar14 + 3) = 0;
    pEVar14[3].type.id = 0;
    *(AtomicRMWOp *)(pEVar14 + 1) = AVar10;
    pEVar14[1].field_0x4 = IVar6;
    pEVar14[1].type.id = (long)dVar2 & 0xffffffffU;
    *(Expression **)(pEVar14 + 2) = pEVar11;
    pEVar14[2].type.id = (uintptr_t)pEVar12;
    (pEVar14->type).id = type.id;
    wasm::AtomicRMW::finalize();
    *(undefined8 *)(pEVar14 + 3) = uVar5;
    pEVar14[3].type.id = uVar3;
  }
  else {
    pEVar13 = make(this,type);
    _Var1.super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>._M_t.
    super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
    super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl =
         (((this->wasm->memories).
           super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start)->_M_t).
         super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>;
    uVar3 = *(uintptr_t *)
             _Var1.super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>._M_t.
             super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
             super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl;
    uVar4 = *(uintptr_t *)
             ((long)_Var1.super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>.
                    _M_t.super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
                    super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl + 8);
    pEVar14 = (Expression *)MixedArena::allocSpace(&((this->builder).wasm)->allocator,0x48,8);
    *(undefined8 *)pEVar14 = 0;
    (pEVar14->type).id = 0;
    *(undefined8 *)(pEVar14 + 1) = 0;
    pEVar14->_id = AtomicCmpxchgId;
    pEVar14[3].type.id = 0;
    *(undefined8 *)(pEVar14 + 4) = 0;
    pEVar14[1]._id = IVar6;
    pEVar14[1].type.id = (long)dVar2 & 0xffffffffU;
    *(Expression **)(pEVar14 + 2) = pEVar11;
    pEVar14[2].type.id = (uintptr_t)pEVar12;
    *(Expression **)(pEVar14 + 3) = pEVar13;
    (pEVar14->type).id = type.id;
    wasm::AtomicCmpxchg::finalize();
    pEVar14[3].type.id = uVar3;
    *(uintptr_t *)(pEVar14 + 4) = uVar4;
  }
  return pEVar14;
}

Assistant:

Expression* TranslateToFuzzReader::makeAtomic(Type type) {
  assert(wasm.features.hasAtomics());
  if (!allowMemory) {
    return makeTrivial(type);
  }
  wasm.memories[0]->shared = true;
  if (type == Type::none) {
    return builder.makeAtomicFence();
  }
  if (type == Type::i32 && oneIn(2)) {
    if (ATOMIC_WAITS && oneIn(2)) {
      auto* ptr = makePointer();
      auto expectedType = pick(Type::i32, Type::i64);
      auto* expected = make(expectedType);
      auto* timeout = make(Type::i64);
      return builder.makeAtomicWait(ptr,
                                    expected,
                                    timeout,
                                    expectedType,
                                    logify(get()),
                                    wasm.memories[0]->name);
    } else {
      auto* ptr = makePointer();
      auto* count = make(Type::i32);
      return builder.makeAtomicNotify(
        ptr, count, logify(get()), wasm.memories[0]->name);
    }
  }
  Index bytes;
  switch (type.getBasic()) {
    case Type::i32: {
      switch (upTo(3)) {
        case 0:
          bytes = 1;
          break;
        case 1:
          bytes = pick(1, 2);
          break;
        case 2:
          bytes = pick(1, 2, 4);
          break;
        default:
          WASM_UNREACHABLE("invalide value");
      }
      break;
    }
    case Type::i64: {
      switch (upTo(4)) {
        case 0:
          bytes = 1;
          break;
        case 1:
          bytes = pick(1, 2);
          break;
        case 2:
          bytes = pick(1, 2, 4);
          break;
        case 3:
          bytes = pick(1, 2, 4, 8);
          break;
        default:
          WASM_UNREACHABLE("invalide value");
      }
      break;
    }
    default:
      WASM_UNREACHABLE("unexpected type");
  }
  auto offset = logify(get());
  auto* ptr = makePointer();
  if (oneIn(2)) {
    auto* value = make(type);
    return builder.makeAtomicRMW(
      pick(RMWAdd, RMWSub, RMWAnd, RMWOr, RMWXor, RMWXchg),
      bytes,
      offset,
      ptr,
      value,
      type,
      wasm.memories[0]->name);
  } else {
    auto* expected = make(type);
    auto* replacement = make(type);
    return builder.makeAtomicCmpxchg(
      bytes, offset, ptr, expected, replacement, type, wasm.memories[0]->name);
  }
}